

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_perform_command(Curl_easy *data)

{
  connectdata *pcVar1;
  SMTP *pSVar2;
  curl_slist *pcVar3;
  char *pcVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *address;
  hostname host;
  char *local_60;
  hostname local_58;
  
  pcVar1 = data->conn;
  pSVar2 = (data->req).p.smtp;
  pcVar3 = pSVar2->rcpt;
  if (pcVar3 == (curl_slist *)0x0) {
    pcVar4 = pSVar2->custom;
    if (pcVar4 == (char *)0x0) {
      pcVar9 = "HELP";
    }
    else {
      pcVar9 = "HELP";
      if (*pcVar4 != '\0') {
        pcVar9 = pcVar4;
      }
    }
    CVar7 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",pcVar9);
  }
  else {
    pcVar4 = pSVar2->custom;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      local_60 = (char *)0x0;
      local_58.name = (char *)0x0;
      local_58.dispname = (char *)0x0;
      local_58.rawalloc = (char *)0x0;
      local_58.encalloc = (char *)0x0;
      CVar7 = smtp_parse_address(pcVar3->data,&local_60,&local_58);
      pcVar4 = local_60;
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      if ((*(byte *)((long)&pcVar1->proto + 0xd0) & 8) == 0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = " SMTPUTF8";
        if ((local_58.encalloc == (char *)0x0) && (_Var5 = Curl_is_ASCII_name(local_60), _Var5)) {
          _Var5 = Curl_is_ASCII_name(local_58.name);
          pcVar9 = " SMTPUTF8";
          if (_Var5) {
            pcVar9 = "";
          }
        }
      }
      pcVar8 = "@";
      pcVar10 = local_58.name;
      if (local_58.name == (char *)0x0) {
        pcVar8 = "";
        pcVar10 = "";
      }
      CVar7 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"VRFY %s%s%s%s",pcVar4,pcVar8,pcVar10,
                            pcVar9);
      (*Curl_cfree)(pcVar4);
    }
    else {
      if ((*(byte *)((long)&pcVar1->proto + 0xd0) & 8) == 0) {
        pcVar9 = "";
      }
      else {
        iVar6 = strcmp(pcVar4,"EXPN");
        pcVar9 = "";
        if (iVar6 == 0) {
          pcVar9 = " SMTPUTF8";
        }
      }
      CVar7 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s %s%s",pcVar4,pcVar3->data,pcVar9);
    }
  }
  if (CVar7 == CURLE_OK) {
    smtp_state(data,SMTP_COMMAND);
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

static CURLcode smtp_perform_command(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct SMTP *smtp = data->req.p.smtp;

  if(smtp->rcpt) {
    /* We notify the server we are sending UTF-8 data if a) it supports the
       SMTPUTF8 extension and b) The mailbox contains UTF-8 characters, in
       either the local address or hostname parts. This is regardless of
       whether the hostname is encoded using IDN ACE */
    bool utf8 = FALSE;

    if((!smtp->custom) || (!smtp->custom[0])) {
      char *address = NULL;
      struct hostname host = { NULL, NULL, NULL, NULL };

      /* Parse the mailbox to verify into the local address and hostname
         parts, converting the hostname to an IDN A-label if necessary */
      result = smtp_parse_address(smtp->rcpt->data,
                                  &address, &host);
      if(result)
        return result;

      /* Establish whether we should report SMTPUTF8 to the server for this
         mailbox as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             ((host.encalloc) || (!Curl_is_ASCII_name(address)) ||
              (!Curl_is_ASCII_name(host.name)));

      /* Send the VRFY command (Note: The hostname part may be absent when the
         host is a local system) */
      result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "VRFY %s%s%s%s",
                             address,
                             host.name ? "@" : "",
                             host.name ? host.name : "",
                             utf8 ? " SMTPUTF8" : "");

      Curl_free_idnconverted_hostname(&host);
      free(address);
    }
    else {
      /* Establish whether we should report that we support SMTPUTF8 for EXPN
         commands to the server as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             (!strcmp(smtp->custom, "EXPN"));

      /* Send the custom recipient based command such as the EXPN command */
      result = Curl_pp_sendf(data, &conn->proto.smtpc.pp,
                             "%s %s%s", smtp->custom,
                             smtp->rcpt->data,
                             utf8 ? " SMTPUTF8" : "");
    }
  }
  else
    /* Send the non-recipient based command such as HELP */
    result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "%s",
                           smtp->custom && smtp->custom[0] != '\0' ?
                           smtp->custom : "HELP");

  if(!result)
    smtp_state(data, SMTP_COMMAND);

  return result;
}